

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeadNode.h
# Opt level: O1

void __thiscall
duckdb_skiplistlib::skip_list::
HeadNode<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
::insert(HeadNode<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
         *this,pair<unsigned_long,_signed_char> *value)

{
  SwappableNodeRefStack<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
  *this_00;
  pointer pNVar1;
  pointer pNVar2;
  Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
  *pNVar3;
  size_t sVar4;
  size_t sVar5;
  Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
  *pNVar6;
  ulong uVar7;
  pointer pNVar8;
  ulong uVar9;
  size_t *psVar10;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  
  this_00 = &this->_nodeRefs;
  lVar11 = (long)(this->_nodeRefs)._nodes.
                 super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->_nodeRefs)._nodes.
                 super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  uVar12 = lVar11 >> 4;
  do {
    bVar13 = uVar12 == 0;
    uVar12 = uVar12 - 1;
    if (bVar13) {
      uVar12 = 0xffffffffffffffff;
      pNVar6 = (Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
                *)0x0;
      break;
    }
    pNVar6 = Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
             ::insert(*(Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
                        **)((long)&(this_00->_nodes).
                                   super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[-1].pNode + lVar11),
                      value);
    lVar11 = lVar11 + -0x10;
  } while (pNVar6 == (Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
                      *)0x0);
  if (pNVar6 == (Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
                 *)0x0) {
    pNVar6 = Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
             ::_Pool::Allocate(&this->_pool,value);
    uVar12 = 0;
  }
  if ((pNVar6->_nodeRefs)._swapLevel <
      (ulong)((long)(pNVar6->_nodeRefs)._nodes.
                    super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pNVar6->_nodeRefs)._nodes.
                    super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4)) {
    while( true ) {
      pNVar8 = (this->_nodeRefs)._nodes.
               super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pNVar1 = (pNVar6->_nodeRefs)._nodes.
               super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(pNVar6->_nodeRefs)._nodes.
                        super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar1) <=
          (ulong)((long)(this->_nodeRefs)._nodes.
                        super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar8)) break;
      SwappableNodeRefStack<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
      ::push_back(this_00,(Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
                           *)0x0,this->_count + 1);
    }
    uVar7 = (pNVar6->_nodeRefs)._swapLevel;
    if (uVar12 < uVar7) {
      psVar10 = &pNVar1[uVar7].width;
      *psVar10 = *psVar10 + pNVar8[uVar12].width;
      uVar12 = uVar12 + 1;
    }
    pNVar8 = (this->_nodeRefs)._nodes.
             super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (uVar12 < (ulong)((long)(this->_nodeRefs)._nodes.
                               super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar8 >> 4)) {
      uVar7 = uVar12 << 4 | 8;
      do {
        uVar9 = (pNVar6->_nodeRefs)._swapLevel;
        pNVar1 = (pNVar6->_nodeRefs)._nodes.
                 super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(pNVar6->_nodeRefs)._nodes.
                          super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar1 >> 4) <= uVar9)
        break;
        *(long *)((long)&pNVar8->pNode + uVar7) =
             (*(long *)((long)&pNVar8->pNode + uVar7) - *(long *)((long)&pNVar1->pNode + uVar7)) + 1
        ;
        pNVar3 = pNVar8[uVar9].pNode;
        sVar4 = pNVar8[uVar9].width;
        sVar5 = pNVar1[uVar9].width;
        pNVar8[uVar9].pNode = pNVar1[uVar9].pNode;
        pNVar8[uVar9].width = sVar5;
        pNVar8 = (pNVar6->_nodeRefs)._nodes.
                 super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (pNVar6->_nodeRefs)._swapLevel;
        pNVar8->pNode = pNVar3;
        pNVar8->width = sVar4;
        uVar9 = (pNVar6->_nodeRefs)._swapLevel + 1;
        (pNVar6->_nodeRefs)._swapLevel = uVar9;
        pNVar8 = (pNVar6->_nodeRefs)._nodes.
                 super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (uVar9 < (ulong)((long)(pNVar6->_nodeRefs)._nodes.
                                  super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar8 >> 4)) {
          pNVar8[uVar9].width =
               *(size_t *)
                ((long)&((this_00->_nodes).
                         super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->pNode + uVar7);
        }
        uVar12 = uVar12 + 1;
        pNVar8 = (this->_nodeRefs)._nodes.
                 super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar7 = uVar7 + 0x10;
      } while (uVar12 < (ulong)((long)(this->_nodeRefs)._nodes.
                                      super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar8 >> 4
                               ));
    }
  }
  uVar12 = uVar12 + (uVar12 < (pNVar6->_nodeRefs)._swapLevel);
  pNVar8 = (this->_nodeRefs)._nodes.
           super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar7 = (long)(this->_nodeRefs)._nodes.
                super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar8 >> 4;
  if (uVar12 < uVar7) {
    pNVar1 = (pNVar6->_nodeRefs)._nodes.
             super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pNVar2 = (pNVar6->_nodeRefs)._nodes.
             super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar10 = &pNVar8[uVar12].width;
    uVar9 = uVar12;
    do {
      if (uVar12 < (ulong)((long)pNVar1 - (long)pNVar2 >> 4)) break;
      *psVar10 = *psVar10 + 1;
      uVar9 = uVar9 + 1;
      psVar10 = psVar10 + 2;
    } while (uVar9 < uVar7);
  }
  this->_count = this->_count + 1;
  return;
}

Assistant:

void HeadNode<T, _Compare>::insert(const T &value) {
#ifdef SKIPLIST_THREAD_SUPPORT
    std::lock_guard<std::mutex> lock(gSkipListMutex);
#ifdef SKIPLIST_THREAD_SUPPORT_TRACE
    std::cout << "HeadNode insert() thread: " << std::this_thread::get_id() << std::endl;
#endif
#endif
    Node<T, _Compare> *pNode = nullptr;
    size_t level = _nodeRefs.height();

    _throwIfValueDoesNotCompare(value);
    while (level-- > 0) {
        assert(_nodeRefs[level].pNode);
        pNode = _nodeRefs[level].pNode->insert(value);
        if (pNode) {
            break;
        }
    }
    if (! pNode) {
        pNode = _pool.Allocate(value);
        level = 0;
    }
    assert(pNode);
    SwappableNodeRefStack<T, _Compare> &thatRefs = pNode->nodeRefs();
    if (thatRefs.canSwap()) {
        // Expand this to that
        while (_nodeRefs.height() < thatRefs.height()) {
            _nodeRefs.push_back(nullptr, _count + 1);
        }
        if (level < thatRefs.swapLevel()) {
            // Happens when we were originally, say 3 high (max height of any
            // previously seen node). Then a node is created
            // say 5 high. In that case this will be at level 2 and
            // thatRefs.swapLevel() will be 3
            assert(level + 1 == thatRefs.swapLevel());
            thatRefs[thatRefs.swapLevel()].width += _nodeRefs[level].width;
            ++level;
        }
        // Now swap
        while (level < _nodeRefs.height() && thatRefs.canSwap()) {
            assert(thatRefs.canSwap());
            assert(level == thatRefs.swapLevel());
            _nodeRefs[level].width -= thatRefs[level].width - 1;
            thatRefs.swap(_nodeRefs);
            if (thatRefs.canSwap()) {
                assert(thatRefs[thatRefs.swapLevel()].width == 0);
                thatRefs[thatRefs.swapLevel()].width = _nodeRefs[level].width;
            }
            ++level;
        }
        // Check all references swapped
        assert(! thatRefs.canSwap());
        // Check that all 'this' pointers created on construction have been moved
        assert(thatRefs.noNodePointerMatches(pNode));
    }
    if (level < thatRefs.swapLevel()) {
        // Happens when we are, say 5 high then a node is created
        // and consumed by the next node say 3 high. In that case this will be
        // at level 2 and thatRefs.swapLevel() will be 3
        assert(level + 1 == thatRefs.swapLevel());
        ++level;
    }
    // Increment my widths as my references are now going over the top of
    // pNode.
    while (level < _nodeRefs.height() && level >= thatRefs.height()) {
        _nodeRefs[level++].width += 1;
    }
    ++_count;
#ifdef SKIPLIST_THREAD_SUPPORT
#ifdef SKIPLIST_THREAD_SUPPORT_TRACE
    std::cout << "HeadNode insert() thread: " << std::this_thread::get_id() << " DONE" << std::endl;
#endif
#endif
}